

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall lzham::symbol_codec::assemble_output_buf(symbol_codec *this)

{
  short sVar1;
  output_symbol *poVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint bits;
  ulong uVar8;
  uint uVar9;
  
  this->m_total_bits_written = 0;
  if ((this->m_output_syms).m_size != 0) {
    uVar8 = 0;
    uVar9 = 0;
    do {
      poVar2 = (this->m_output_syms).m_p;
      sVar1 = poVar2[uVar8].m_num_bits;
      if (sVar1 == -3) {
        if ((this->m_arith_output_buf).m_size == 0) goto LAB_001159d9;
        this->m_arith_value = 0;
        this->m_arith_length = 0xffffffff;
        uVar7 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        uVar5 = (uint)(this->m_arith_output_buf).m_p[uVar7];
        this->m_arith_value = uVar5;
        bVar4 = put_bits(this,uVar5,8);
        uVar5 = 0;
        if (bVar4) {
          do {
            uVar6 = uVar5;
            uVar5 = uVar9 + uVar6;
            if (uVar6 == 3) goto LAB_001159b4;
            uVar5 = (uint)(this->m_arith_output_buf).m_p[uVar9 + uVar6];
            this->m_arith_value = this->m_arith_value << 8 | uVar5;
            bVar4 = put_bits(this,uVar5,8);
            uVar5 = uVar6 + 1;
          } while (bVar4);
          uVar5 = uVar9 + uVar6 + 1;
LAB_001159b4:
          uVar9 = uVar5;
          uVar5 = (uint)(2 < uVar6);
        }
        if ((char)uVar5 != '\0') goto LAB_001159d9;
LAB_001159c2:
        bVar4 = false;
      }
      else {
        if (sVar1 == -1) {
          uVar5 = this->m_arith_length;
          while (uVar5 < 0x1000000) {
            bits = 0;
            if (uVar9 < (this->m_arith_output_buf).m_size) {
              uVar7 = (ulong)uVar9;
              uVar9 = uVar9 + 1;
              bits = (uint)(this->m_arith_output_buf).m_p[uVar7];
            }
            bVar4 = put_bits(this,bits,8);
            if (!bVar4) goto LAB_001159c2;
            this->m_arith_value = this->m_arith_value << 8 | bits;
            uVar5 = this->m_arith_length << 8;
            this->m_arith_length = uVar5;
          }
          uVar5 = this->m_arith_value;
          uVar6 = (this->m_arith_length >> 0xb) * (uint)poVar2[uVar8].m_arith_prob0;
          bVar4 = uVar6 <= uVar5;
          if (bVar4) {
            this->m_arith_value = uVar5 - uVar6;
            uVar6 = this->m_arith_length - uVar6;
          }
          this->m_arith_length = uVar6;
          if (poVar2[uVar8].m_bits != (uint)bVar4) {
            lzham_assert("bit == sym.m_bits",
                         "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_symbol_codec.cpp"
                         ,0x49c);
          }
        }
        else if (sVar1 == -2) {
          uVar5 = -this->m_bit_count & 7;
          if (uVar5 != 0) {
            bVar4 = false;
            bVar3 = put_bits(this,0,8 - uVar5);
            if (!bVar3) goto LAB_001159dc;
          }
        }
        else {
          bVar4 = put_bits(this,poVar2[uVar8].m_bits,(int)sVar1);
          if (!bVar4) goto LAB_001159c2;
        }
LAB_001159d9:
        bVar4 = true;
      }
LAB_001159dc:
      if (!bVar4) {
        return false;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this->m_output_syms).m_size);
  }
  bVar4 = put_bits(this,0,7);
  return bVar4;
}

Assistant:

bool symbol_codec::assemble_output_buf()
   {
      m_total_bits_written = 0;

      uint arith_buf_ofs = 0;

      // Intermix the final Arithmetic, Huffman, or plain bits to a single combined bitstream.
      // All bits from each source must be output in exactly the same order that the decompressor will read them.
      for (uint sym_index = 0; sym_index < m_output_syms.size(); sym_index++)
      {
         const output_symbol& sym = m_output_syms[sym_index];

         if (sym.m_num_bits == output_symbol::cAlignToByteSym)
         {
            if (!put_bits_align_to_byte())
            {
               LZHAM_LOG_ERROR(4026);
               return false;
            }
         }
         else if (sym.m_num_bits == output_symbol::cArithInit)
         {
            LZHAM_ASSERT(m_arith_output_buf.size());

            if (m_arith_output_buf.size())
            {
               m_arith_length = cSymbolCodecArithMaxLen;
               m_arith_value = 0;
               for (uint i = 0; i < 4; i++)
               {
                  const uint c = m_arith_output_buf[arith_buf_ofs++];
                  m_arith_value = (m_arith_value << 8) | c;
                  if (!put_bits(c, 8))
                  {
                     LZHAM_LOG_ERROR(4027);
                     return false;
                  }
               }
            }
         }
         else if (sym.m_num_bits == output_symbol::cArithSym)
         {
            // This renorm logic must match the logic used in the arithmetic decoder.
            if (m_arith_length < cSymbolCodecArithMinLen)
            {
               do
               {
                  const uint c = (arith_buf_ofs < m_arith_output_buf.size()) ? m_arith_output_buf[arith_buf_ofs++] : 0;
                  if (!put_bits(c, 8))
                  {
                     LZHAM_LOG_ERROR(4028);
                     return false;
                  }
                  m_arith_value = (m_arith_value << 8) | c;
               } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
            }

            uint x = sym.m_arith_prob0 * (m_arith_length >> cSymbolCodecArithProbBits);
            uint bit = (m_arith_value >= x);

            if (bit == 0)
            {
               m_arith_length = x;
            }
            else
            {
               m_arith_value  -= x;
               m_arith_length -= x;
            }

            LZHAM_VERIFY(bit == sym.m_bits);
         }
         else
         {
            // Huffman or plain bits
            if (!put_bits(sym.m_bits, sym.m_num_bits))
            {
               LZHAM_LOG_ERROR(4029);
               return false;
            }
         }
      }

      return flush_bits();
   }